

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  int iVar5;
  char *pcVar6;
  uint in_ECX;
  ImGuiTabBar *in_RDX;
  char *in_RSI;
  ImGuiTabBar *in_RDI;
  bool bVar7;
  undefined1 uVar8;
  byte bVar9;
  float _x;
  ImVec2 IVar10;
  ImGuiID in_stack_00000038;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  char *in_stack_00000040;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  bool pressed;
  bool held;
  ImRect *in_stack_00000050;
  bool hovered;
  ImGuiButtonFlags button_flags;
  bool want_clip_rect;
  ImRect bb;
  ImVec2 pos;
  ImVec2 backup_main_cursor_pos;
  bool tab_contents_visible;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  bool tab_is_new;
  ImGuiTabItem *tab;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  ImGuiHoveredFlags in_stack_fffffffffffffec0;
  ImGuiItemFlags in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined1 repeat;
  undefined8 in_stack_fffffffffffffed0;
  ImRect *pIVar11;
  ImRect *in_stack_fffffffffffffed8;
  ImRect *nav_bb_arg;
  undefined4 in_stack_fffffffffffffee0;
  ImGuiID in_stack_fffffffffffffee4;
  ImGuiID id_00;
  char cVar12;
  ImGuiTabBar *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  ImGuiID in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  byte local_f2;
  ImVec2 local_ec;
  float in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint flags_00;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  float local_c8;
  float local_c4;
  ImVec2 local_c0;
  ImRect local_b8;
  ImVec2 local_a8;
  ImGuiNavHighlightFlags in_stack_ffffffffffffff68;
  ImGuiID in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  byte bVar13;
  undefined1 uVar14;
  ImGuiTabItem *local_68;
  float local_5c;
  bool local_1;
  
  uVar14 = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  if ((in_RDI->WantLayout & 1U) != 0) {
    TabBarLayout(in_RDX);
  }
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->SkipItems & 1U) == 0) {
    IVar4 = TabBarCalcTabID((ImGuiTabBar *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                            (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if ((in_RDX == (ImGuiTabBar *)0x0) || (((in_RDX->Tabs).Size & 1) != 0)) {
      IVar10 = TabItemCalcSize((char *)in_stack_fffffffffffffed8,(bool)uVar14);
      local_68 = TabBarFindTabByID((ImGuiTabBar *)
                                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
      bVar7 = local_68 == (ImGuiTabItem *)0x0;
      local_5c = IVar10.x;
      if (bVar7) {
        in_stack_fffffffffffffee8 = in_RDI;
        ImGuiTabItem::ImGuiTabItem((ImGuiTabItem *)&stack0xffffffffffffff78);
        ImVector<ImGuiTabItem>::push_back
                  ((ImVector<ImGuiTabItem> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (ImGuiTabItem *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_68 = ImVector<ImGuiTabItem>::back(&in_RDI->Tabs);
        local_68->ID = IVar4;
        local_68->Width = local_5c;
      }
      iVar5 = ImVector<ImGuiTabItem>::index_from_ptr(&in_RDI->Tabs,local_68);
      in_RDI->LastTabItemIdx = (short)iVar5;
      local_68->WidthContents = local_5c;
      uVar14 = in_RDI->PrevFrameVisible + 1 < pIVar3->FrameCount;
      uVar8 = (in_RDI->Flags & 0x400000U) != 0;
      bVar13 = local_68->LastFrameVisible + 1 < pIVar3->FrameCount;
      local_68->LastFrameVisible = pIVar3->FrameCount;
      local_68->Flags = in_ECX;
      if ((!(bool)bVar13) && ((in_RDI->Flags & 1U) == 0)) {
        local_68->Offset = in_RDI->OffsetNextTab;
        in_RDI->OffsetNextTab =
             local_68->Width + (pIVar3->Style).ItemInnerSpacing.x + in_RDI->OffsetNextTab;
      }
      if (((((bool)bVar13) && ((in_RDI->Flags & 2U) != 0)) && (in_RDI->NextSelectedTabId == 0)) &&
         ((!(bool)uVar14 || (in_RDI->SelectedTabId == 0)))) {
        in_RDI->NextSelectedTabId = IVar4;
      }
      bVar9 = in_RDI->VisibleTabId == IVar4;
      if ((bool)bVar9) {
        in_RDI->VisibleTabWasSubmitted = true;
      }
      else if (((in_RDI->SelectedTabId == 0) && ((bool)uVar14)) &&
              (((in_RDI->Tabs).Size == 1 && ((in_RDI->Flags & 2U) == 0)))) {
        bVar9 = true;
      }
      if ((!(bool)bVar13) || (((bool)uVar14 && (!bVar7)))) {
        if (in_RDI->SelectedTabId == IVar4) {
          local_68->LastFrameSelected = pIVar3->FrameCount;
        }
        local_a8 = (pIVar2->DC).CursorPos;
        pIVar11 = &in_RDI->BarRect;
        nav_bb_arg = &local_b8;
        ImVec2::ImVec2(&nav_bb_arg->Min,(float)(int)local_68->Offset - in_RDI->ScrollingAnim,0.0);
        local_b8.Max = operator+((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                 (ImVec2 *)0x191b9a);
        (pIVar2->DC).CursorPos = local_b8.Max;
        local_c0 = (pIVar2->DC).CursorPos;
        IVar10 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (ImVec2 *)0x191be6);
        ImRect::ImRect((ImRect *)&stack0xffffffffffffff30,&local_c0,
                       (ImVec2 *)&stack0xffffffffffffff28);
        id_00 = CONCAT13(1,(int3)in_stack_fffffffffffffee4);
        if ((in_RDI->BarRect).Min.x <= in_stack_ffffffffffffff30) {
          id_00 = CONCAT13((in_RDI->BarRect).Max.x <= local_c8,(int3)in_stack_fffffffffffffee4);
        }
        cVar12 = (char)(id_00 >> 0x18);
        flags_00 = CONCAT13(cVar12,(int3)in_stack_ffffffffffffff24);
        if (cVar12 != '\0') {
          _x = ImMax<float>(in_stack_ffffffffffffff30,(in_RDI->BarRect).Min.x);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff1c,_x,in_stack_ffffffffffffff34 - 1.0);
          ImVec2::ImVec2(&local_ec,(in_RDI->BarRect).Max.x,local_c4);
          PushClipRect((ImVec2 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (ImVec2 *)in_stack_fffffffffffffee8,SUB41(id_00 >> 0x18,0));
        }
        ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
        bVar7 = ItemAdd((ImRect *)in_stack_fffffffffffffee8,id_00,nav_bb_arg);
        if (bVar7) {
          bVar7 = ButtonBehavior((ImRect *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                 in_stack_fffffffffffffef4,(bool *)in_stack_fffffffffffffee8,
                                 (bool *)CONCAT44(id_00,in_stack_fffffffffffffee0),
                                 (ImGuiButtonFlags)((ulong)nav_bb_arg >> 0x20));
          if ((bVar7) || (((in_ECX & 2) != 0 && ((bVar9 & 1) == 0)))) {
            in_RDI->NextSelectedTabId = IVar4;
          }
          if ((local_f2 & 1) == 0) {
            SetItemAllowOverlap();
          }
          if (((((local_f2 & 1) != 0) && ((bVar13 & 1) == 0)) &&
              (bVar7 = IsMouseDragging(0,-1.0), bVar7)) &&
             (((pIVar3->DragDropActive & 1U) == 0 && ((in_RDI->Flags & 1U) != 0)))) {
            pIVar1 = &(pIVar3->IO).MouseDelta;
            if ((0.0 < pIVar1->x || pIVar1->x == 0.0) ||
               (in_stack_ffffffffffffff30 <= (pIVar3->IO).MousePos.x)) {
              if (((0.0 < (pIVar3->IO).MouseDelta.x) && (local_c8 < (pIVar3->IO).MousePos.x)) &&
                 ((in_RDI->Flags & 1U) != 0)) {
                TabBarQueueChangeTabOrder(in_RDI,local_68,1);
              }
            }
            else if ((in_RDI->Flags & 1U) != 0) {
              TabBarQueueChangeTabOrder(in_RDI,local_68,-1);
            }
          }
          repeat = 0;
          GetColorU32((ImGuiCol)((ulong)pIVar11 >> 0x20),SUB84(pIVar11,0));
          iVar5 = (int)pIVar11;
          TabItemBackground((ImDrawList *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (ImRect *)IVar10,flags_00,(ImU32)in_stack_ffffffffffffff20);
          RenderNavHighlight((ImRect *)
                             CONCAT17(uVar14,CONCAT16(uVar8,CONCAT15(bVar13,CONCAT14(bVar9,
                                                  in_stack_ffffffffffffff70)))),
                             in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
          bVar7 = IsItemHovered(in_stack_fffffffffffffec0);
          if ((bVar7) &&
             ((bVar7 = IsMouseClicked(iVar5,(bool)repeat), bVar7 ||
              (bVar7 = IsMouseReleased(1), bVar7)))) {
            in_RDI->NextSelectedTabId = IVar4;
          }
          if (in_RDX != (ImGuiTabBar *)0x0) {
            ImGuiWindow::GetID((ImGuiWindow *)
                               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                               (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                              );
          }
          bVar7 = TabItemLabelAndCloseButton
                            (_button_flags,in_stack_00000050,display_draw_list._4_4_,
                             in_stack_00000040,close_button_id,in_stack_00000038);
          if (bVar7) {
            *(undefined1 *)&(in_RDX->Tabs).Size = 0;
            TabBarCloseTab(in_RDI,local_68);
          }
          if ((flags_00 & 0x1000000) != 0) {
            PopClipRect();
          }
          (pIVar2->DC).CursorPos = local_a8;
          if ((((pIVar3->HoveredId == IVar4) && ((local_f2 & 1) == 0)) &&
              (0.5 < pIVar3->HoveredIdNotActiveTimer)) && ((in_RDI->Flags & 0x20U) == 0)) {
            pcVar6 = FindRenderedTextEnd(in_RSI,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar6 - (int)in_RSI),in_RSI);
          }
          local_1 = (bool)(bVar9 & 1);
        }
        else {
          if ((flags_00 & 0x1000000) != 0) {
            PopClipRect();
          }
          (pIVar2->DC).CursorPos = local_a8;
          local_1 = (bool)(bVar9 & 1);
        }
      }
      else {
        PushItemFlag(in_stack_fffffffffffffec4,SUB41((uint)in_stack_fffffffffffffec0 >> 0x18,0));
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        ItemAdd((ImRect *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                in_stack_fffffffffffffed8);
        PopItemFlag();
        local_1 = (bool)(bVar9 & 1);
      }
    }
    else {
      PushItemFlag(in_stack_fffffffffffffec4,SUB41((uint)in_stack_fffffffffffffec0 >> 0x18,0));
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      ItemAdd((ImRect *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
              in_stack_fffffffffffffed8);
      PopItemFlag();
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->WidthContents = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2((float)(int)tab->Offset - tab_bar->ScrollingAnim, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x >= tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    hovered |= (g.HoveredId == id);
    if (pressed || ((flags & ImGuiTabItemFlags_SetSelected) && !tab_contents_visible)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->WidthContents)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + (float)(int)ImLerp(bb.GetWidth(), tab->WidthContents, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f));
        display_draw_list = GetOverlayDrawList(window);
        TabItemRenderBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, label, id, close_button_id);
    if (just_closed)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f)
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}